

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_stream.cpp
# Opt level: O1

void __thiscall cppnet::LogStream::~LogStream(LogStream *this)

{
  element_type *peVar1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  shared_ptr<cppnet::Log> local_18;
  
  peVar1 = (this->_log).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) &&
     ((this->_call_back).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_18.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->_log).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_18.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_18.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_18.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_18.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_18.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_18.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    if ((this->_call_back).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar3);
    }
    (*(this->_call_back)._M_invoker)((_Any_data *)&this->_call_back,&local_18);
    if (local_18.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_18.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  p_Var2 = (this->_call_back).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->_call_back,(_Any_data *)&this->_call_back,__destroy_functor);
  }
  this_00 = (this->_log).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

LogStream::~LogStream() {
    if (_log && _call_back) {
        _call_back(_log);
    }
}